

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O3

uint32_t ndn_lite_default_aes_parse_unpadding_size(uint8_t *plaintext_value,uint32_t plaintext_size)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  
  pbVar5 = plaintext_value + ((ulong)plaintext_size - 1);
  bVar1 = *pbVar5;
  lVar3 = 0;
  do {
    if (bVar1 == "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10"[lVar3]) {
      bVar6 = 1;
      if (1 < bVar1) {
        bVar6 = bVar1;
      }
      bVar2 = true;
      do {
        bVar2 = (bool)(bVar2 & *pbVar5 == bVar1);
        bVar6 = bVar6 - 1;
      } while (bVar6 != 0);
      uVar4 = 0;
      if (bVar2) {
        uVar4 = ~(uint)lVar3;
      }
      return plaintext_size + uVar4;
    }
    lVar3 = lVar3 + 1;
    pbVar5 = pbVar5 + -1;
  } while (lVar3 != 0x10);
  return plaintext_size;
}

Assistant:

uint32_t
ndn_lite_default_aes_parse_unpadding_size(uint8_t* plaintext_value, uint32_t plaintext_size)
{
  for (uint8_t i = 0; i < TC_AES_BLOCK_SIZE; i++)
    if (*(plaintext_value + plaintext_size - 1) == byte[i]) {
      bool satisfy = true;
      for (uint8_t j = 0; j < byte[i]; j++) {
        if (*(plaintext_value + plaintext_size - 1 - i) != byte[i]) {
          satisfy = false;
        }
      }
      if (satisfy) {
        return plaintext_size - i - 1;
      }
      else {
        return plaintext_size;
      }
    }
  return plaintext_size;
}